

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNode.cpp
# Opt level: O0

void __thiscall ODDLParser::DDLNode::~DDLNode(DDLNode *this)

{
  Property *this_00;
  Value *this_01;
  DataArrayList *this_02;
  DDLNode *this_03;
  reference ppDVar1;
  size_type sVar2;
  ulong local_18;
  size_t i;
  DDLNode *this_local;
  
  this_00 = this->m_properties;
  if (this_00 != (Property *)0x0) {
    Property::~Property(this_00);
    operator_delete(this_00);
  }
  this_01 = this->m_value;
  if (this_01 != (Value *)0x0) {
    Value::~Value(this_01);
    operator_delete(this_01);
  }
  releaseReferencedNames(this->m_references);
  this_02 = this->m_dtArrayList;
  if (this_02 != (DataArrayList *)0x0) {
    DataArrayList::~DataArrayList(this_02);
    operator_delete(this_02);
  }
  this->m_dtArrayList = (DataArrayList *)0x0;
  ppDVar1 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::operator[]
                      ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
                       s_allocatedNodes,this->m_idx);
  if (*ppDVar1 == this) {
    ppDVar1 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::operator[]
                        ((vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_> *)
                         s_allocatedNodes,this->m_idx);
    *ppDVar1 = (value_type)0x0;
  }
  local_18 = 0;
  while( true ) {
    sVar2 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::size
                      (&this->m_children);
    if (sVar2 <= local_18) break;
    ppDVar1 = std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::operator[]
                        (&this->m_children,local_18);
    this_03 = *ppDVar1;
    if (this_03 != (DDLNode *)0x0) {
      ~DDLNode(this_03);
      operator_delete(this_03);
    }
    local_18 = local_18 + 1;
  }
  std::vector<ODDLParser::DDLNode_*,_std::allocator<ODDLParser::DDLNode_*>_>::~vector
            (&this->m_children);
  std::__cxx11::string::~string((string *)&this->m_name);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

DDLNode::~DDLNode() {
    delete m_properties;
    delete m_value;
    releaseReferencedNames( m_references );

    delete m_dtArrayList;
    m_dtArrayList = ddl_nullptr;
    if( s_allocatedNodes[ m_idx ] == this ) {
        s_allocatedNodes[ m_idx ] = ddl_nullptr;
    }
    for ( size_t i = 0; i<m_children.size(); i++ ){
        delete m_children[ i ];
    }
}